

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

string * __thiscall ApprovalTests::Path::removeRedundantDirectorySeparators(Path *this,string *path)

{
  string *in_RDX;
  string *in_RDI;
  string reducePath;
  bool changed;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator *in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  string local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [48];
  string local_80 [32];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  
  local_19 = 1;
  while ((local_19 & 1) != 0) {
    ::std::__cxx11::string::string(local_40,in_RDX);
    ::std::__cxx11::string::string(local_80,local_40);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_b0,"//",&local_b1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_d8,"/",&local_d9);
    StringUtils::replaceAll
              ((string *)in_stack_fffffffffffffe58,(string *)in_stack_fffffffffffffe50,
               (string *)in_stack_fffffffffffffe48);
    in_stack_fffffffffffffe58 = local_40;
    in_stack_fffffffffffffe50 = local_60;
    ::std::__cxx11::string::operator=(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    ::std::__cxx11::string::~string(in_stack_fffffffffffffe50);
    ::std::__cxx11::string::~string(local_d8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    ::std::__cxx11::string::~string(local_b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    ::std::__cxx11::string::~string(local_80);
    ::std::__cxx11::string::string(local_120,in_stack_fffffffffffffe58);
    in_stack_fffffffffffffe48 = &local_141;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_140,"\\\\",in_stack_fffffffffffffe48);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_168,"\\",&local_169);
    StringUtils::replaceAll
              ((string *)in_stack_fffffffffffffe58,(string *)in_stack_fffffffffffffe50,
               (string *)in_stack_fffffffffffffe48);
    __lhs = &local_100;
    ::std::__cxx11::string::operator=(local_40,(string *)__lhs);
    ::std::__cxx11::string::~string((string *)__lhs);
    ::std::__cxx11::string::~string(local_168);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_169);
    ::std::__cxx11::string::~string(local_140);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
    ::std::__cxx11::string::~string(local_120);
    local_19 = ::std::operator!=(__lhs,in_stack_fffffffffffffe28);
    ::std::__cxx11::string::operator=(in_RDX,local_40);
    ::std::__cxx11::string::~string(local_40);
  }
  ::std::__cxx11::string::string((string *)in_RDI,in_RDX);
  return in_RDI;
}

Assistant:

std::string Path::removeRedundantDirectorySeparators(std::string path) const
    {
        bool changed = true;
        while (changed)
        {
            std::string reducePath = path;
            reducePath = StringUtils::replaceAll(reducePath, "//", "/");
            reducePath = StringUtils::replaceAll(reducePath, "\\\\", "\\");
            changed = (reducePath != path);
            path = reducePath;
        };
        return path;
    }